

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# euarel.cc
# Opt level: O2

string * OB::Euarel::url_encode(string *__return_storage_ptr__,string *str,bool form)

{
  byte bVar1;
  pointer pcVar2;
  size_type sVar3;
  int iVar4;
  char c;
  size_type sVar5;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_78;
  string local_58;
  string *local_38;
  
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  __return_storage_ptr__->_M_string_length = 0;
  (__return_storage_ptr__->field_2)._M_local_buf[0] = '\0';
  local_38 = __return_storage_ptr__;
  std::__cxx11::string::reserve((ulong)__return_storage_ptr__);
  pcVar2 = (str->_M_dataplus)._M_p;
  sVar3 = str->_M_string_length;
  for (sVar5 = 0; sVar3 != sVar5; sVar5 = sVar5 + 1) {
    bVar1 = pcVar2[sVar5];
    if (bVar1 == 0x20 && form) {
      std::__cxx11::string::append((char *)local_38);
    }
    else {
      iVar4 = isalnum((uint)bVar1);
      if ((((iVar4 == 0) && (1 < bVar1 - 0x2d)) && (bVar1 != 0x7e)) && (bVar1 != 0x5f)) {
        hex_encode_abi_cxx11_(&local_58,(Euarel *)(ulong)(uint)(int)(char)bVar1,c);
        std::operator+(&local_78,"%",&local_58);
        std::__cxx11::string::append((string *)local_38);
        std::__cxx11::string::~string((string *)&local_78);
        std::__cxx11::string::~string((string *)&local_58);
      }
      else {
        std::__cxx11::string::push_back((char)local_38);
      }
    }
  }
  return local_38;
}

Assistant:

std::string url_encode(std::string const& str, bool form)
{
  std::string res;
  res.reserve(str.size());

  for (auto const& e : str)
  {
    if (e == ' ' && form)
    {
      res += "+";
    }
    else if (std::isalnum(static_cast<unsigned char>(e)) ||
      e == '-' || e == '_' || e == '.' || e == '~')
    {
      res += e;
    }
    else
    {
      res += "%" + hex_encode(e);
    }
  }

  return res;
}